

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

clip_image_size llava_uhd::get_best_grid(int max_slice_nums,int multiple,float log_ratio)

{
  bool bVar1;
  reference piVar2;
  reference pcVar3;
  int in_ESI;
  int in_EDI;
  int __x;
  float in_XMM0_Da;
  double extraout_XMM0_Qa;
  float error;
  clip_image_size *grid;
  iterator __end1_2;
  iterator __begin1_2;
  vector<clip_image_size,_std::allocator<clip_image_size>_> *__range1_2;
  float min_error;
  int m;
  int split_grids_nums;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  vector<clip_image_size,_std::allocator<clip_image_size>_> candidate_grids;
  int i;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> *__range1;
  vector<int,_std::allocator<int>_> candidate_split_grids_nums;
  clip_image_size best_grid;
  value_type *in_stack_fffffffffffffef8;
  initializer_list<int> *in_stack_ffffffffffffff00;
  value_type_conflict1 *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  __normal_iterator<clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
  local_d8;
  undefined1 *local_d0;
  float local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int *local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [44];
  int local_6c;
  int *local_68;
  int *local_60;
  int local_54;
  int local_50;
  int local_4c;
  initializer_list<int> local_48;
  initializer_list<int> *local_38;
  undefined1 local_30 [28];
  float local_14;
  int local_10;
  int local_c;
  clip_image_size local_8;
  __normal_iterator<clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
  *this;
  
  local_14 = in_XMM0_Da;
  local_10 = in_ESI;
  local_c = in_EDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1e1a8b);
  local_54 = local_10 + -1;
  local_50 = local_10;
  local_4c = local_10 + 1;
  local_48._M_array = &local_54;
  local_48._M_len = 3;
  local_38 = &local_48;
  local_60 = std::initializer_list<int>::begin(local_38);
  local_68 = std::initializer_list<int>::end(in_stack_ffffffffffffff00);
  for (; local_60 != local_68; local_60 = local_60 + 1) {
    local_6c = *local_60;
    if ((local_6c != 1) && (local_6c <= local_c)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
    }
  }
  std::vector<clip_image_size,_std::allocator<clip_image_size>_>::vector
            ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)0x1e1ba2);
  local_a0 = local_30;
  local_a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
  local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff00,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffef8), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_a8);
    local_b4 = *piVar2;
    for (local_b8 = 1; local_b8 <= local_b4; local_b8 = local_b8 + 1) {
      if (local_b4 % local_b8 == 0) {
        local_c0 = local_b8;
        local_bc = local_b4 / local_b8;
        std::vector<clip_image_size,_std::allocator<clip_image_size>_>::push_back
                  ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)
                   in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_a8);
  }
  local_8.width = 1;
  local_8.height = 1;
  local_c4 = std::numeric_limits<float>::infinity();
  local_d0 = local_98;
  local_d8._M_current =
       (clip_image_size *)
       std::vector<clip_image_size,_std::allocator<clip_image_size>_>::begin
                 ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)
                  in_stack_fffffffffffffef8);
  std::vector<clip_image_size,_std::allocator<clip_image_size>_>::end
            ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)in_stack_fffffffffffffef8)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
                             *)in_stack_fffffffffffffef8), bVar1) {
    this = &local_d8;
    pcVar3 = __gnu_cxx::
             __normal_iterator<clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
             ::operator*(this);
    __x = (int)this;
    in_stack_ffffffffffffff00 = (initializer_list<int> *)(double)local_14;
    log((double)pcVar3->width / (double)pcVar3->height);
    std::abs(__x);
    in_stack_ffffffffffffff14 = (float)extraout_XMM0_Qa;
    if (in_stack_ffffffffffffff14 < local_c4) {
      local_8 = *pcVar3;
      local_c4 = in_stack_ffffffffffffff14;
    }
    __gnu_cxx::
    __normal_iterator<clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
    ::operator++(&local_d8);
  }
  std::vector<clip_image_size,_std::allocator<clip_image_size>_>::~vector
            ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return local_8;
}

Assistant:

static clip_image_size get_best_grid(const int max_slice_nums, const int multiple, const float log_ratio) {
        std::vector<int> candidate_split_grids_nums;
        for (int i : {multiple - 1, multiple, multiple + 1}) {
            if (i == 1 || i > max_slice_nums) {
                continue;
            }
            candidate_split_grids_nums.push_back(i);
        }

        std::vector<clip_image_size> candidate_grids;
        for (int split_grids_nums : candidate_split_grids_nums) {
            int m = 1;
            while (m <= split_grids_nums) {
                if (split_grids_nums % m == 0) {
                    candidate_grids.push_back(clip_image_size{m, split_grids_nums / m});
                }
                ++m;
            }
        }

        clip_image_size best_grid{1, 1};
        float min_error = std::numeric_limits<float>::infinity();
        for (const auto& grid : candidate_grids) {
            float error = std::abs(log_ratio - std::log(1.0 * grid.width / grid.height));
            if (error < min_error) {
                best_grid = grid;
                min_error = error;
            }
        }
        return best_grid;
    }